

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::unsetCursor(QGraphicsItem *this)

{
  bool bVar1;
  QGraphicsItemPrivate *pQVar2;
  const_iterator o;
  QGraphicsView **ppQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsView *view;
  QList<QGraphicsView_*> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QGraphicsView_*> views;
  QList<QGraphicsView_*> *in_stack_ffffffffffffff80;
  QGraphicsScene *in_stack_ffffffffffffff88;
  QPoint *pos;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar5;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->(&in_RDI->d_ptr);
  if ((*(ulong *)&pQVar2->field_0x160 >> 0xf & 1) != 0) {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              (&in_RDI->d_ptr);
    QGraphicsItemPrivate::unsetExtra
              ((QGraphicsItemPrivate *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
               ,(Extra)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->d_ptr);
    *(ulong *)&pQVar2->field_0x160 = *(ulong *)&pQVar2->field_0x160 & 0xffffffffffff7fff;
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&in_RDI->d_ptr);
    if (pQVar2->scene != (QGraphicsScene *)0x0) {
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&in_RDI->d_ptr);
      QGraphicsScene::views(in_stack_ffffffffffffff88);
      local_28.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_28 = QList<QGraphicsView_*>::begin(in_stack_ffffffffffffff80);
      o = QList<QGraphicsView_*>::end(in_stack_ffffffffffffff80);
      while (bVar1 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_28,o), bVar1) {
        ppQVar3 = QList<QGraphicsView_*>::const_iterator::operator*(&local_28);
        pos = (QPoint *)*ppQVar3;
        bVar1 = QWidget::underMouse((QWidget *)0x97b2ab);
        uVar5 = false;
        if (bVar1) {
          QCursor::pos();
          QWidget::mapFromGlobal((QWidget *)CONCAT17(uVar5,in_stack_ffffffffffffff90),pos);
          pQVar4 = QGraphicsView::itemAt
                             ((QGraphicsView *)in_RDI,
                              (QPoint *)CONCAT17(uVar5,in_stack_ffffffffffffff90));
          uVar5 = pQVar4 == in_RDI;
        }
        if ((bool)uVar5 != false) {
          QMetaObject::invokeMethod<>
                    ((QObject *)in_RDI,(char *)CONCAT17(uVar5,in_stack_ffffffffffffff90));
          break;
        }
        QList<QGraphicsView_*>::const_iterator::operator++(&local_28);
      }
      QList<QGraphicsView_*>::~QList((QList<QGraphicsView_*> *)0x97b342);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::unsetCursor()
{
    if (!d_ptr->hasCursor)
        return;
    d_ptr->unsetExtra(QGraphicsItemPrivate::ExtraCursor);
    d_ptr->hasCursor = 0;
    if (d_ptr->scene) {
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            if (view->underMouse() && view->itemAt(view->mapFromGlobal(QCursor::pos())) == this) {
                QMetaObject::invokeMethod(view, "_q_unsetViewportCursor");
                break;
            }
        }
    }
}